

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

void set_inter_deferred(Am_Object *inter,Am_Input_Event *ev,Am_Object *event_window,Am_Object *obj,
                       Am_Input_Char deferring)

{
  int iVar1;
  Deferred_Event_Holder *this;
  Am_Input_Char want_ic;
  Am_Object local_48;
  Am_Object *local_40;
  Am_Object *local_38;
  
  want_ic = deferring;
  local_40 = inter;
  local_38 = obj;
  this = (Deferred_Event_Holder *)operator_new(0x30);
  (this->inter).data = (Am_Object_Data *)0x0;
  (this->event_window).data = (Am_Object_Data *)0x0;
  (this->obj).data = (Am_Object_Data *)0x0;
  Am_Input_Char::Am_Input_Char(&this->want_ic,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  Am_Input_Char::Am_Input_Char(&this->got_ic,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  Am_Object::operator=((Am_Object *)this,local_40);
  Am_Object::operator=(&this->obj,local_38);
  Am_Input_Char::operator=(&this->want_ic,&want_ic);
  Am_Input_Char::operator=(&this->got_ic,&ev->input_char);
  iVar1 = ev->y;
  this->x = ev->x;
  this->y = iVar1;
  Am_Object::operator=(&this->event_window,event_window);
  this->next = Am_List_Of_Deferred_Events;
  Am_List_Of_Deferred_Events = this;
  Am_Object::Am_Object(&local_48,event_window);
  set_want_move_one_win(&local_48,true);
  Am_Object::~Am_Object(&local_48);
  return;
}

Assistant:

static void
set_inter_deferred(Am_Object &inter, Am_Input_Event *ev,
                   Am_Object &event_window, Am_Object &obj,
                   Am_Input_Char deferring)
{
  Am_Input_Char want_ic = deferring;
  Deferred_Event_Holder *holder = new Deferred_Event_Holder;
  holder->inter = inter;
  holder->obj = obj;
  holder->want_ic = want_ic;
  holder->got_ic = ev->input_char;
  holder->x = ev->x;
  holder->y = ev->y;
  holder->event_window = event_window;
  holder->next = Am_List_Of_Deferred_Events;
  Am_List_Of_Deferred_Events = holder;
  Am_INTER_TRACE_PRINT(inter, "Adding " << inter << " to deferred list");
  //turn on mouse moved
  set_want_move_one_win(event_window, true);
}